

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmutex.cpp
# Opt level: O2

CK_RV OSUnlockMutex(CK_VOID_PTR mutex)

{
  int iVar1;
  CK_RV CStackY_20;
  
  if (mutex == (CK_VOID_PTR)0x0) {
    softHSMLog(3,"OSUnlockMutex",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
               ,0x7e,"Cannot unlock NULL mutex");
    CStackY_20 = 7;
  }
  else {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
    if (iVar1 == 0) {
      CStackY_20 = 0;
    }
    else {
      softHSMLog(3,"OSUnlockMutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
                 ,0x85,"Failed to unlock POSIX mutex 0x%08X (0x%08X)",mutex,iVar1);
      CStackY_20 = 5;
    }
  }
  return CStackY_20;
}

Assistant:

CK_RV OSUnlockMutex(CK_VOID_PTR mutex)
{
	int rv;
	pthread_mutex_t* pthreadMutex = (pthread_mutex_t*) mutex;

	if (pthreadMutex == NULL)
	{
		ERROR_MSG("Cannot unlock NULL mutex");

		return CKR_ARGUMENTS_BAD;
	}

	if ((rv = pthread_mutex_unlock(pthreadMutex)) != 0)
	{
		ERROR_MSG("Failed to unlock POSIX mutex 0x%08X (0x%08X)", pthreadMutex, rv);

		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}